

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffseekeof(bifcxdef *ctx,int argc)

{
  FILE *__stream;
  undefined4 in_ESI;
  int *in_RDI;
  osfildef *fp;
  undefined4 in_stack_fffffffffffffff0;
  
  __stream = (FILE *)bif_get_file((bifcxdef *)fp,in_RDI,
                                  (int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  fseek(__stream,0,2);
  return;
}

Assistant:

void biffseekeof(bifcxdef *ctx, int argc)
{
    osfildef *fp;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* seek to the end */
    osfseek(fp, 0L, OSFSK_END);
}